

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_rtree_query_callback
              (sqlite3 *db,char *zQueryFunc,_func_int_sqlite3_rtree_query_info_ptr *xQueryFunc,
              void *pContext,_func_void_void_ptr *xDestructor)

{
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc;
  undefined8 in_RCX;
  char *in_RDX;
  sqlite3 *in_RSI;
  code *in_R8;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *unaff_retaddr;
  _func_void_sqlite3_context_ptr *in_stack_00000008;
  _func_void_void_ptr *in_stack_00000010;
  RtreeGeomCallback *pGeomCtx;
  undefined8 in_stack_ffffffffffffffa8;
  int local_4;
  
  xSFunc = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
           sqlite3_malloc((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  if (xSFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
    if (in_R8 != (code *)0x0) {
      (*in_R8)(in_RCX);
    }
    local_4 = 7;
  }
  else {
    *(undefined8 *)xSFunc = 0;
    *(char **)(xSFunc + 8) = in_RDX;
    *(code **)(xSFunc + 0x10) = in_R8;
    *(undefined8 *)(xSFunc + 0x18) = in_RCX;
    local_4 = sqlite3_create_function_v2
                        (in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,in_R8,xSFunc,
                         unaff_retaddr,in_stack_00000008,in_stack_00000010);
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_rtree_query_callback(
  sqlite3 *db,                 /* Register SQL function on this connection */
  const char *zQueryFunc,      /* Name of new SQL function */
  int (*xQueryFunc)(sqlite3_rtree_query_info*), /* Callback */
  void *pContext,              /* Extra data passed into the callback */
  void (*xDestructor)(void*)   /* Destructor for the extra data */
){
  RtreeGeomCallback *pGeomCtx;      /* Context object for new user-function */

  /* Allocate and populate the context object. */
  pGeomCtx = (RtreeGeomCallback *)sqlite3_malloc(sizeof(RtreeGeomCallback));
  if( !pGeomCtx ){
    if( xDestructor ) xDestructor(pContext);
    return SQLITE_NOMEM;
  }
  pGeomCtx->xGeom = 0;
  pGeomCtx->xQueryFunc = xQueryFunc;
  pGeomCtx->xDestructor = xDestructor;
  pGeomCtx->pContext = pContext;
  return sqlite3_create_function_v2(db, zQueryFunc, -1, SQLITE_ANY,
      (void *)pGeomCtx, geomCallback, 0, 0, rtreeFreeCallback
  );
}